

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O3

int io_file_read(lua_State *L,IOFileUD *iof,int start)

{
  byte bVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  uint64_t uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  size_t sVar9;
  GCstr *pGVar10;
  ulong uVar11;
  uint sz;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  TValue local_38;
  
  pTVar2 = L->top;
  pTVar3 = L->base;
  clearerr((FILE *)iof);
  iVar13 = (int)((ulong)((long)pTVar2 - (long)pTVar3) >> 3) - start;
  if (iVar13 == 0) {
    uVar5 = io_file_readline(L,(FILE *)iof,1);
    uVar12 = (ulong)(start + 1);
  }
  else {
    luaL_checkstack(L,iVar13 + 0x14,"too many arguments");
    uVar12 = (ulong)start;
    uVar5 = 1;
    do {
      uVar11 = L->base[uVar12].it64 >> 0x2f;
      if (uVar11 == 0xfffffffffffffffb) {
        uVar11 = L->base[uVar12].it64 & 0x7fffffffffff;
        bVar1 = *(byte *)(uVar11 + 0x18 + (ulong)(*(char *)(uVar11 + 0x18) == '*'));
        if (bVar1 == 0x6e) {
          iVar6 = __isoc99_fscanf(iof,"%lf",&local_38);
          if (iVar6 == 1) {
            pTVar2 = L->top;
            L->top = pTVar2 + 1;
            *pTVar2 = local_38;
            uVar5 = 1;
          }
          else {
            pTVar2 = L->top;
            L->top = pTVar2 + 1;
            pTVar2->u64 = 0xffffffffffffffff;
            uVar5 = 0;
          }
        }
        else if ((bVar1 & 0xdf) == 0x4c) {
          uVar5 = io_file_readline(L,(FILE *)iof,(uint)(bVar1 == 0x6c));
        }
        else {
          if (bVar1 != 0x61) {
            lj_err_arg(L,(int)uVar12 + 1,LJ_ERR_INVFMT);
          }
          uVar11 = 0;
          sz = 0x2000;
          do {
            pcVar8 = lj_buf_tmp(L,sz);
            sVar9 = fread(pcVar8 + uVar11,1,(ulong)(sz - (int)uVar11),(FILE *)iof);
            uVar7 = (int)sVar9 + (int)uVar11;
            uVar11 = (ulong)sz;
            bVar14 = uVar7 == sz;
            sz = sz * 2;
          } while (bVar14);
          pTVar2 = L->top;
          L->top = pTVar2 + 1;
          pGVar10 = lj_str_new(L,pcVar8,(ulong)uVar7);
          pTVar2->u64 = (ulong)pGVar10 | 0xfffd800000000000;
          uVar4 = (L->glref).ptr64;
          if (*(ulong *)(uVar4 + 0x18) <= *(ulong *)(uVar4 + 0x10)) {
            lj_gc_step(L);
          }
        }
      }
      else {
        iVar6 = (int)uVar12 + 1;
        if (0xfffffffffffffff2 < uVar11) {
          lj_err_arg(L,iVar6,LJ_ERR_INVOPT);
        }
        uVar5 = lj_lib_checkint(L,iVar6);
        if (uVar5 == 0) {
          iVar6 = getc((FILE *)iof);
          ungetc(iVar6,(FILE *)iof);
          uVar4 = (L->glref).ptr64;
          pTVar2 = L->top;
          L->top = pTVar2 + 1;
          pTVar2->u64 = uVar4 + 0x78 | 0xfffd800000000000;
          bVar14 = iVar6 != -1;
        }
        else {
          pcVar8 = lj_buf_tmp(L,uVar5);
          sVar9 = fread(pcVar8,1,(ulong)uVar5,(FILE *)iof);
          pTVar2 = L->top;
          L->top = pTVar2 + 1;
          pGVar10 = lj_str_new(L,pcVar8,sVar9 & 0xffffffff);
          pTVar2->u64 = (ulong)pGVar10 | 0xfffd800000000000;
          uVar4 = (L->glref).ptr64;
          if (*(ulong *)(uVar4 + 0x18) <= *(ulong *)(uVar4 + 0x10)) {
            lj_gc_step(L);
          }
          bVar14 = (sVar9 & 0xffffffff) != 0;
        }
        uVar5 = (uint)bVar14;
      }
      iVar13 = iVar13 + -1;
      uVar12 = uVar12 + 1;
    } while ((iVar13 != 0) && (uVar5 != 0));
  }
  iVar13 = ferror((FILE *)iof);
  if (iVar13 == 0) {
    if (uVar5 == 0) {
      L->top[-1].u64 = 0xffffffffffffffff;
    }
    iVar13 = (int)uVar12 - start;
  }
  else {
    iVar13 = luaL_fileresult(L,0,(char *)0x0);
  }
  return iVar13;
}

Assistant:

static int io_file_read(lua_State *L, IOFileUD *iof, int start)
{
  FILE *fp = iof->fp;
  int ok, n, nargs = (int)(L->top - L->base) - start;
  clearerr(fp);
  if (nargs == 0) {
    ok = io_file_readline(L, fp, 1);
    n = start+1;  /* Return 1 result. */
  } else {
    /* The results plus the buffers go on top of the args. */
    luaL_checkstack(L, nargs+LUA_MINSTACK, "too many arguments");
    ok = 1;
    for (n = start; nargs-- && ok; n++) {
      if (tvisstr(L->base+n)) {
	const char *p = strVdata(L->base+n);
	if (p[0] == '*') p++;
	if (p[0] == 'n')
	  ok = io_file_readnum(L, fp);
	else if ((p[0] & ~0x20) == 'L')
	  ok = io_file_readline(L, fp, (p[0] == 'l'));
	else if (p[0] == 'a')
	  io_file_readall(L, fp);
	else
	  lj_err_arg(L, n+1, LJ_ERR_INVFMT);
      } else if (tvisnumber(L->base+n)) {
	ok = io_file_readlen(L, fp, (MSize)lj_lib_checkint(L, n+1));
      } else {
	lj_err_arg(L, n+1, LJ_ERR_INVOPT);
      }
    }
  }
  if (ferror(fp))
    return luaL_fileresult(L, 0, NULL);
  if (!ok)
    setnilV(L->top-1);  /* Replace last result with nil. */
  return n - start;
}